

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O3

void Abc_FrameSetJsonObjs(Vec_Wec_t *vObjs)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Abc_Frame_t *pAVar1;
  int iVar2;
  Vec_Int_t *__ptr_01;
  long lVar3;
  long lVar4;
  Abc_Frame_t *pAVar5;
  
  pAVar1 = s_GlobalFrame;
  __ptr = s_GlobalFrame->vJsonObjs;
  pAVar5 = s_GlobalFrame;
  if (__ptr == (Vec_Wec_t *)0x0) goto LAB_0034c650;
  iVar2 = __ptr->nCap;
  __ptr_01 = __ptr->pArray;
  if (iVar2 < 1) {
    if (__ptr_01 != (Vec_Int_t *)0x0) goto LAB_0034c62e;
  }
  else {
    lVar3 = 8;
    lVar4 = 0;
    do {
      __ptr_00 = *(void **)((long)&__ptr_01->nCap + lVar3);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        __ptr_01 = __ptr->pArray;
        *(undefined8 *)((long)&__ptr_01->nCap + lVar3) = 0;
        iVar2 = __ptr->nCap;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < iVar2);
LAB_0034c62e:
    free(__ptr_01);
  }
  pAVar5 = s_GlobalFrame;
  free(__ptr);
  pAVar1->vJsonObjs = (Vec_Wec_t *)0x0;
LAB_0034c650:
  pAVar5->vJsonObjs = vObjs;
  return;
}

Assistant:

void        Abc_FrameSetJsonObjs( Vec_Wec_t * vObjs )        { Vec_WecFreeP(&s_GlobalFrame->vJsonObjs ); s_GlobalFrame->vJsonObjs = vObjs; }